

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenStructAccessor
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,
          ImportMap *imports)

{
  BaseType BVar1;
  
  GenComment(&(field->super_Definition).doc_comment,code_ptr,
             (CommentConfig *)(anonymous_namespace)::def_comment,
             (anonymous_namespace)::Indent_abi_cxx11_);
  BVar1 = (field->value).type.base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    if (struct_def->fixed == true) {
      GetScalarFieldOfStruct(this,struct_def,field,code_ptr);
    }
    else {
      GetScalarFieldOfTable(this,struct_def,field,code_ptr);
    }
    goto LAB_001dfcd3;
  }
  switch(BVar1) {
  case BASE_TYPE_STRING:
    GetStringField(this,struct_def,field,code_ptr,imports);
    break;
  case BASE_TYPE_VECTOR:
    if ((field->value).type.element == BASE_TYPE_STRUCT) {
      GetMemberOfVectorOfStruct(this,struct_def,field,code_ptr,imports);
      break;
    }
    GetMemberOfVectorOfNonStruct(this,struct_def,field,code_ptr);
    goto LAB_001dfca0;
  case BASE_TYPE_STRUCT:
    if (struct_def->fixed == true) {
      GetStructFieldOfStruct(this,struct_def,field,code_ptr);
    }
    else {
      GetStructFieldOfTable(this,struct_def,field,code_ptr,imports);
    }
    break;
  case BASE_TYPE_UNION:
    GetUnionField(this,struct_def,field,code_ptr,imports);
    break;
  case BASE_TYPE_ARRAY:
    if ((field->value).type.element == BASE_TYPE_STRUCT) {
      GetArrayOfStruct(this,struct_def,field,code_ptr,imports);
      break;
    }
    GetArrayOfNonStruct(this,struct_def,field,code_ptr);
LAB_001dfca0:
    if ((((this->super_BaseGenerator).parser_)->opts).python_gen_numpy == true) {
      GetVectorOfNonStructAsNumpy(this,struct_def,field,code_ptr);
    }
    GetVectorAsNestedFlatbuffer(this,struct_def,field,code_ptr,imports);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_python.cpp"
                  ,0x5d9,
                  "void flatbuffers::python::PythonGenerator::GenStructAccessor(const StructDef &, const FieldDef &, std::string *, ImportMap &) const"
                 );
  }
LAB_001dfcd3:
  BVar1 = (field->value).type.base_type;
  if ((BVar1 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) &&
     ((0x64000U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    GetVectorLen(this,struct_def,field,code_ptr);
    GetVectorIsNone(this,struct_def,field,code_ptr);
    return;
  }
  return;
}

Assistant:

void GenStructAccessor(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr, ImportMap &imports) const {
    GenComment(field.doc_comment, code_ptr, &def_comment, Indent.c_str());
    if (IsScalar(field.value.type.base_type)) {
      if (struct_def.fixed) {
        GetScalarFieldOfStruct(struct_def, field, code_ptr);
      } else {
        GetScalarFieldOfTable(struct_def, field, code_ptr);
      }
    } else {
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT:
          if (struct_def.fixed) {
            GetStructFieldOfStruct(struct_def, field, code_ptr);
          } else {
            GetStructFieldOfTable(struct_def, field, code_ptr, imports);
          }
          break;
        case BASE_TYPE_STRING:
          GetStringField(struct_def, field, code_ptr, imports);
          break;
        case BASE_TYPE_VECTOR: {
          auto vectortype = field.value.type.VectorType();
          if (vectortype.base_type == BASE_TYPE_STRUCT) {
            GetMemberOfVectorOfStruct(struct_def, field, code_ptr, imports);
          } else {
            GetMemberOfVectorOfNonStruct(struct_def, field, code_ptr);
            if (parser_.opts.python_gen_numpy) {
              GetVectorOfNonStructAsNumpy(struct_def, field, code_ptr);
            }
            GetVectorAsNestedFlatbuffer(struct_def, field, code_ptr, imports);
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          auto vectortype = field.value.type.VectorType();
          if (vectortype.base_type == BASE_TYPE_STRUCT) {
            GetArrayOfStruct(struct_def, field, code_ptr, imports);
          } else {
            GetArrayOfNonStruct(struct_def, field, code_ptr);
            if (parser_.opts.python_gen_numpy) {
              GetVectorOfNonStructAsNumpy(struct_def, field, code_ptr);
            }
            GetVectorAsNestedFlatbuffer(struct_def, field, code_ptr, imports);
          }
          break;
        }
        case BASE_TYPE_UNION:
          GetUnionField(struct_def, field, code_ptr, imports);
          break;
        default: FLATBUFFERS_ASSERT(0);
      }
    }
    if (IsVector(field.value.type) || IsArray(field.value.type)) {
      GetVectorLen(struct_def, field, code_ptr);
      GetVectorIsNone(struct_def, field, code_ptr);
    }
  }